

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ConversionError * CLI::ConversionError::TooManyInputsFlag(string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000018;
  ConversionError *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  ::std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ConversionError(in_stack_00000020,in_stack_00000018);
  ::std::__cxx11::string::~string(this);
  return (ConversionError *)in_RDI;
}

Assistant:

static ConversionError TooManyInputsFlag(std::string name) {
        return ConversionError(name + ": too many inputs for a flag");
    }